

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

hash_code llvm::detail::hash_value(DoubleAPFloat *Arg)

{
  APFloat *Arg_00;
  hash_code hVar1;
  hash_code local_20;
  hash_code local_18;
  
  Arg_00 = (Arg->Floats)._M_t.
           super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
           super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
           super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
  if (Arg_00 != (APFloat *)0x0) {
    local_18 = llvm::hash_value(Arg_00);
    local_20 = llvm::hash_value((Arg->Floats)._M_t.
                                super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                                .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1);
    hVar1 = hash_combine<llvm::hash_code,llvm::hash_code>(&local_18,&local_20);
    return (hash_code)hVar1.value;
  }
  hVar1 = hash_combine<llvm::fltSemantics_const*>(&Arg->Semantics);
  return (hash_code)hVar1.value;
}

Assistant:

hash_code hash_value(const DoubleAPFloat &Arg) {
  if (Arg.Floats)
    return hash_combine(hash_value(Arg.Floats[0]), hash_value(Arg.Floats[1]));
  return hash_combine(Arg.Semantics);
}